

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O3

void dlep_radio_terminate_all_sessions(void)

{
  avl_tree *paVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  paVar1 = dlep_if_get_tree(true);
  plVar2 = (paVar1->list_head).next;
  plVar3 = plVar2->prev;
  paVar1 = dlep_if_get_tree(true);
  if (plVar3 != (paVar1->list_head).prev) {
    do {
      for (plVar3 = plVar2[3].prev; plVar3->prev != plVar2[4].next; plVar3 = plVar3->next) {
        dlep_session_terminate
                  ((dlep_session *)&plVar3[-0x38].prev,DLEP_STATUS_OKAY,
                   "DLEP radio is shutting down");
      }
      plVar2 = plVar2->next;
      plVar3 = plVar2->prev;
      paVar1 = dlep_if_get_tree(true);
    } while (plVar3 != (paVar1->list_head).prev);
  }
  return;
}

Assistant:

void
dlep_radio_terminate_all_sessions(void) {
  struct dlep_radio_if *interf;
  struct dlep_radio_session *radio_session;

  _shutting_down = true;

  avl_for_each_element(dlep_if_get_tree(true), interf, interf._node) {
    avl_for_each_element(&interf->interf.session_tree, radio_session, _node) {
      dlep_session_terminate(&radio_session->session, DLEP_STATUS_OKAY, "DLEP radio is shutting down");
    }
  }
}